

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TargetType targetType;
  char *pcVar6;
  size_t sVar7;
  string *psVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ulong uVar13;
  ulong uVar14;
  uint c;
  char cVar15;
  undefined3 in_register_00000089;
  string output;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string launcher;
  string cmd;
  string currentBinDir;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string workingDir;
  string shellCommand;
  string local_288;
  undefined4 local_264;
  cmRulePlaceholderExpander *local_260;
  string local_258;
  cmCustomCommandGenerator *local_238;
  string local_230;
  string local_210;
  cmOutputConverter *local_1f0;
  cmGeneratorTarget *local_1e8;
  string local_1e0;
  string local_1c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  string local_180;
  string *local_160;
  undefined1 local_158 [104];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  
  local_1e8 = target;
  local_1a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  local_160 = relative;
  if (CONCAT31(in_register_00000089,echo_comment) != 0) {
    pcVar6 = cmCustomCommandGenerator::GetComment(ccg);
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      local_158._0_8_ = local_158 + 0x10;
      sVar7 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,pcVar6,pcVar6 + sVar7);
      AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1a0,(string *)local_158,EchoGenerate,(EchoProgress *)0x0);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
      }
    }
  }
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  pcVar1 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar1,pcVar1 + psVar8->_M_string_length);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_180,ccg);
  if (local_180._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_1c0);
  }
  if (content != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (content,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  }
  iVar4 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                    (this);
  local_260 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar4);
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = ccg;
  psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  pcVar1 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar1,pcVar1 + psVar8->_M_string_length);
  local_1f0 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  c = 0;
  do {
    uVar5 = cmCustomCommandGenerator::GetNumberOfCommands(local_238);
    if (uVar5 <= c) {
      CreateCDCommand(this,&local_198,&local_1c0,local_160);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (local_1a0,*(undefined8 *)(local_1a0 + 8),
                 local_198.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_198.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      if (local_260 != (cmRulePlaceholderExpander *)0x0) {
        std::default_delete<cmRulePlaceholderExpander>::operator()
                  ((default_delete<cmRulePlaceholderExpander> *)&local_260,local_260);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&local_210,local_238,c);
    if (local_210._M_string_length != 0) {
      bVar3 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar3) {
        local_158._0_8_ = local_158 + 0x10;
        local_158._8_8_ = (char *)0x0;
        local_158[0x10] = '\0';
        if (local_210._M_string_length < 5) {
LAB_002e05f7:
          local_264 = 0;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_288,(ulong)&local_210);
          cmsys::SystemTools::LowerCase(&local_258,&local_288);
          std::__cxx11::string::operator=((string *)local_158,(string *)&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,
                            CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                     local_258.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                     local_288.field_2._M_local_buf[0]) + 1);
          }
          uVar9 = std::__cxx11::string::compare(local_158);
          if ((int)uVar9 != 0) {
            uVar9 = std::__cxx11::string::compare(local_158);
            if ((int)uVar9 != 0) goto LAB_002e05f7;
          }
          local_264 = (undefined4)CONCAT71((int7)((ulong)uVar9 >> 8),1);
        }
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
        }
      }
      else {
        local_264 = 0;
      }
      cmsys::SystemTools::ReplaceString(&local_210,"/./","/");
      cVar15 = (char)&local_210;
      lVar10 = std::__cxx11::string::find(cVar15,0x2f);
      if (local_180._M_string_length == 0) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)local_158,(cmLocalGenerator *)this,&local_1e0,&local_210);
        std::__cxx11::string::operator=((string *)&local_210,(string *)local_158);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
        }
      }
      lVar11 = std::__cxx11::string::find(cVar15,0x2f);
      if ((lVar10 != -1) && (lVar11 == -1)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,"./",&local_210);
        std::__cxx11::string::operator=((string *)&local_210,(string *)local_158);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
        }
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"RULE_LAUNCH_CUSTOM","");
      pcVar6 = cmLocalGenerator::GetRuleLauncher
                         ((cmLocalGenerator *)this,local_1e8,(string *)local_158);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
      }
      if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
        cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_158);
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(local_1e8);
        local_158._0_8_ = (psVar8->_M_dataplus)._M_p;
        targetType = cmGeneratorTarget::GetType(local_1e8);
        local_158._8_8_ = cmState::GetTargetTypeName(targetType);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        pvVar12 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(local_238);
        if ((pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)&local_288);
          if (local_180._M_string_length == 0) {
            psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                               ((cmLocalGenerator *)this);
            cmLocalGenerator::MaybeConvertToRelativePath
                      (&local_230,(cmLocalGenerator *)this,psVar8,&local_288);
            std::__cxx11::string::operator=((string *)&local_288,(string *)&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
          }
          cmOutputConverter::ConvertToOutputFormat(&local_230,local_1f0,&local_288,SHELL);
          std::__cxx11::string::operator=((string *)&local_288,(string *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
        }
        sVar2 = local_258._M_string_length;
        local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_288._M_dataplus._M_p;
        strlen(pcVar6);
        std::__cxx11::string::_M_replace((ulong)&local_258,0,(char *)sVar2,(ulong)pcVar6);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_260,local_1f0,&local_258,(RuleVariables *)local_158);
        if ((char *)local_258._M_string_length != (char *)0x0) {
          std::__cxx11::string::append((char *)&local_258);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
      }
      MaybeConvertWatcomShellCommand((string *)local_158,this,&local_210);
      if ((char *)local_158._8_8_ == (char *)0x0) {
        cmOutputConverter::ConvertToOutputFormat(&local_288,local_1f0,&local_210,SHELL);
        std::__cxx11::string::operator=((string *)local_158,(string *)&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
      }
      std::operator+(&local_288,&local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
      ;
      std::__cxx11::string::operator=((string *)&local_210,(string *)&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      cmCustomCommandGenerator::AppendArguments(local_238,c,&local_210);
      if (content != (ostream *)0x0) {
        if (local_210._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)content + (int)content->_vptr_basic_ostream[-3]);
        }
        else {
          pcVar6 = local_210._M_dataplus._M_p + local_258._M_string_length;
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(content,pcVar6,sVar7);
        }
      }
      if (this->BorlandMakeCurlyHack == true) {
        uVar13 = std::__cxx11::string::find(cVar15,0x7b);
        if ((uVar13 != 0xffffffffffffffff) && (uVar13 < local_210._M_string_length - 1)) {
          uVar14 = std::__cxx11::string::find(cVar15,0x7d);
          if (uVar13 < uVar14) {
            std::__cxx11::string::substr((ulong)&local_288,(ulong)&local_210);
            std::__cxx11::string::append((char *)&local_288);
            std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_210);
            std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_230._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::_M_assign((string *)&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,
                              CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                       local_288.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
      if ((char *)local_258._M_string_length == (char *)0x0) {
        if ((char)local_264 == '\0') {
          bVar3 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((!bVar3) || (*local_210._M_dataplus._M_p != '\"')) goto LAB_002e0b61;
          std::operator+(&local_288,"echo >nul && ",&local_210);
        }
        else {
          std::operator+(&local_288,"call ",&local_210);
        }
        std::__cxx11::string::operator=((string *)&local_210,(string *)&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
      }
LAB_002e0b61:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
                 &local_210);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    c = c + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    const char* comment = ccg.GetComment();
    if (comment && *comment) {
      this->AppendEcho(commands, comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeConvertToRelativePath(currentBinDir, cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = "./" + cmd;
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      const char* val = this->GetRuleLauncher(target, "RULE_LAUNCH_CUSTOM");
      if (val && *val) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType = cmState::GetTargetTypeName(target->GetType());
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeConvertToRelativePath(
              this->GetCurrentBinaryDirectory(), output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            std::string hack_cmd = cmd.substr(0, lcurly);
            hack_cmd += "{{}";
            hack_cmd += cmd.substr(lcurly + 1);
            cmd = hack_cmd;
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = "call " + cmd;
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = "echo >nul && " + cmd;
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  // push back the custom commands
  commands.insert(commands.end(), commands1.begin(), commands1.end());
}